

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_59db9::TestXmlTestReporterFixtureFailureMessageIsXMLEscaped::RunImpl
          (TestXmlTestReporterFixtureFailureMessageIsXMLEscaped *this)

{
  TestDetails *details;
  XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper fixtureHelper;
  
  details = &(this->super_Test).m_details;
  XmlTestReporterFixture::XmlTestReporterFixture(&fixtureHelper.super_XmlTestReporterFixture);
  fixtureHelper.m_details = details;
  UnitTest::
  ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureFailureMessageIsXMLEscapedHelper>
            (&fixtureHelper,details);
  XmlTestReporterFixture::~XmlTestReporterFixture(&fixtureHelper.super_XmlTestReporterFixture);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, FailureMessageIsXMLEscaped)
{
    TestDetails const details("TestName", "suite", "filename.h", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "\"\'&<>");
    reporter.ReportTestFinish(details, 0.1f);
    reporter.ReportSummary(1, 1, 1, 0.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"TestName\" time=\"0.1\">"
        "<failure message=\"filename.h(4321) : &quot;&apos;&amp;&lt;&gt;\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}